

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool __thiscall
math::wide_integer::uintwide_t<32u,unsigned_int,void,true>::wr_string<char*>
          (uintwide_t<32u,unsigned_int,void,true> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  char cVar1;
  unsigned_fast_type uVar2;
  ulong uVar3;
  bool bVar4;
  size_type_conflict sVar5;
  uint uVar6;
  const_iterator puVar7;
  byte *pbVar8;
  reference pcVar9;
  size_type sVar10;
  pointer pcVar11;
  uintwide_t<32U,_unsigned_int,_void,_true> *v;
  reference pcVar12;
  pointer pcVar13;
  char local_119;
  unsigned_long local_c0;
  unsigned_fast_type local_b8;
  unsigned_fast_type dst;
  signed_fast_type pos_2;
  string_storage_hex_type str_temp_2;
  uintwide_t<32U,_unsigned_int,_void,_false> t_2;
  array<unsigned_int,_1UL> local_84;
  representation_type local_80;
  array<unsigned_int,_1UL> local_7c;
  ulong uStack_78;
  uintwide_t<32U,_unsigned_int,_void,_true> tmp;
  signed_fast_type pos_1;
  string_storage_dec_type str_temp_1;
  bool str_has_neg_sign;
  uintwide_t<32U,_unsigned_int,_void,_true> t_1;
  byte local_49;
  ulong uStack_48;
  char c;
  signed_fast_type pos;
  string_storage_oct_type str_temp;
  limb_type mask;
  uintwide_t<32U,_unsigned_int,_void,_false> t;
  bool wr_string_is_ok;
  bool is_uppercase_local;
  bool show_pos_local;
  bool show_base_local;
  uint_fast8_t base_rep_local;
  char *str_result_local;
  uintwide_t<32U,_unsigned_int,_void,_true> *this_local;
  
  mask._3_1_ = true;
  if (base_rep == '\b') {
    uintwide_t<32U,_unsigned_int,_void,_false>::uintwide_t<true,_nullptr>
              ((uintwide_t<32U,_unsigned_int,_void,_false> *)
               (str_temp.super_array<char,_19UL>.elems + 0xf),
               (uintwide_t<32U,_unsigned_int,_void,_true> *)this);
    str_temp.super_array<char,_19UL>.elems[0xb] = '\a';
    str_temp.super_array<char,_19UL>.elems[0xc] = '\0';
    str_temp.super_array<char,_19UL>.elems[0xd] = '\0';
    str_temp.super_array<char,_19UL>.elems[0xe] = '\0';
    memset((void *)((long)&pos + 5),0,0x13);
    detail::fixed_static_array<char,_19U>::fixed_static_array
              ((fixed_static_array<char,_19U> *)((long)&pos + 5));
    sVar5 = detail::fixed_static_array<char,_19U>::static_size();
    uStack_48 = (ulong)(sVar5 - 1);
    bVar4 = uintwide_t<32U,_unsigned_int,_void,_false>::is_zero
                      ((uintwide_t<32U,_unsigned_int,_void,_false> *)
                       (str_temp.super_array<char,_19UL>.elems + 0xf));
    if (bVar4) {
      uStack_48 = uStack_48 - 1;
      pcVar9 = detail::fixed_static_array<char,_19U>::operator[]
                         ((fixed_static_array<char,_19U> *)((long)&pos + 5),
                          (size_type_conflict)uStack_48);
      *pcVar9 = '0';
    }
    else {
      while (bVar4 = uintwide_t<32U,_unsigned_int,_void,_false>::is_zero
                               ((uintwide_t<32U,_unsigned_int,_void,_false> *)
                                (str_temp.super_array<char,_19UL>.elems + 0xf)),
            !bVar4 && 0 < (long)uStack_48) {
        puVar7 = detail::array_detail::array<unsigned_int,_1UL>::cbegin
                           ((array<unsigned_int,_1UL> *)
                            (str_temp.super_array<char,_19UL>.elems + 0xf));
        local_49 = (byte)*puVar7 & 7;
        if (local_49 < 9) {
          local_49 = local_49 + 0x30;
        }
        uStack_48 = uStack_48 - 1;
        pbVar8 = (byte *)detail::fixed_static_array<char,_19U>::operator[]
                                   ((fixed_static_array<char,_19U> *)((long)&pos + 5),
                                    (size_type_conflict)uStack_48);
        *pbVar8 = local_49;
        uintwide_t<32u,unsigned_int,void,false>::operator>>=
                  ((uintwide_t<32u,unsigned_int,void,false> *)
                   (str_temp.super_array<char,_19UL>.elems + 0xf),3);
      }
    }
    if ((show_base) && (0 < (long)uStack_48)) {
      uStack_48 = uStack_48 - 1;
      pcVar9 = detail::fixed_static_array<char,_19U>::operator[]
                         ((fixed_static_array<char,_19U> *)((long)&pos + 5),
                          (size_type_conflict)uStack_48);
      *pcVar9 = '0';
    }
    if ((show_pos) && (0 < (long)uStack_48)) {
      uStack_48 = uStack_48 - 1;
      pcVar9 = detail::fixed_static_array<char,_19U>::operator[]
                         ((fixed_static_array<char,_19U> *)((long)&pos + 5),
                          (size_type_conflict)uStack_48);
      *pcVar9 = '+';
    }
    if (field_width != 0) {
      sVar10 = detail::array_detail::array<char,_19UL>::size();
      register0x00000000 = sVar10 - 1;
      field_width = detail::min_unsafe<unsigned_long>
                              (&field_width,
                               (unsigned_long *)(str_temp_1.super_array<char,_19UL>.elems + 0x10));
      while (sVar10 = detail::array_detail::array<char,_19UL>::size(), cVar1 = fill_char_str,
            (long)((sVar10 - 1) - field_width) < (long)uStack_48) {
        uStack_48 = uStack_48 - 1;
        pcVar9 = detail::fixed_static_array<char,_19U>::operator[]
                           ((fixed_static_array<char,_19U> *)((long)&pos + 5),
                            (size_type_conflict)uStack_48);
        *pcVar9 = cVar1;
      }
    }
    sVar10 = detail::array_detail::array<char,_19UL>::size();
    pcVar9 = detail::fixed_static_array<char,_19U>::operator[]
                       ((fixed_static_array<char,_19U> *)((long)&pos + 5),(int)sVar10 - 1);
    *pcVar9 = '\0';
    pcVar11 = detail::array_detail::array<char,_19UL>::data((array<char,_19UL> *)((long)&pos + 5));
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar11 + uStack_48);
  }
  else if (base_rep == '\n') {
    str_temp_1.super_array<char,_19UL>.elems._12_4_ = *(undefined4 *)this;
    str_temp_1.super_array<char,_19UL>.elems[0xb] =
         uintwide_t<32U,_unsigned_int,_void,_true>::is_neg<true>
                   ((uintwide_t<32U,_unsigned_int,_void,_true> *)
                    (str_temp_1.super_array<char,_19UL>.elems + 0xc),(enable_if_t<true,_int> *)0x0);
    if ((bool)str_temp_1.super_array<char,_19UL>.elems[0xb]) {
      uintwide_t<32U,_unsigned_int,_void,_true>::negate
                ((uintwide_t<32U,_unsigned_int,_void,_true> *)
                 (str_temp_1.super_array<char,_19UL>.elems + 0xc));
    }
    memset(&pos_1,0,0x13);
    detail::fixed_static_array<char,_19U>::fixed_static_array
              ((fixed_static_array<char,_19U> *)&pos_1);
    sVar5 = detail::fixed_static_array<char,_19U>::static_size();
    uStack_78 = (ulong)(sVar5 - 1);
    bVar4 = uintwide_t<32U,_unsigned_int,_void,_true>::is_zero
                      ((uintwide_t<32U,_unsigned_int,_void,_true> *)
                       (str_temp_1.super_array<char,_19UL>.elems + 0xc));
    if (bVar4) {
      uStack_78 = uStack_78 - 1;
      pcVar9 = detail::fixed_static_array<char,_19U>::operator[]
                         ((fixed_static_array<char,_19U> *)&pos_1,(size_type_conflict)uStack_78);
      *pcVar9 = '0';
    }
    else {
      while (bVar4 = uintwide_t<32U,_unsigned_int,_void,_true>::is_zero
                               ((uintwide_t<32U,_unsigned_int,_void,_true> *)
                                (str_temp_1.super_array<char,_19UL>.elems + 0xc)),
            !bVar4 && 0 < (long)uStack_78) {
        local_7c.elems[0] =
             (value_type_conflict  [1])
             (value_type_conflict  [1])str_temp_1.super_array<char,_19UL>.elems._12_4_;
        uintwide_t<32U,_unsigned_int,_void,_true>::eval_divide_by_single_limb
                  ((uintwide_t<32U,_unsigned_int,_void,_true> *)
                   (str_temp_1.super_array<char,_19UL>.elems + 0xc),10,0,
                   (uintwide_t<32U,_unsigned_int,_void,_true> *)0x0);
        local_84.elems[0] =
             (value_type_conflict  [1])
             (value_type_conflict  [1])str_temp_1.super_array<char,_19UL>.elems._12_4_;
        v = uintwide_t<32U,_unsigned_int,_void,_true>::mul_by_limb
                      ((uintwide_t<32U,_unsigned_int,_void,_true> *)&local_84,10);
        local_80.super_array<unsigned_int,_1UL>.elems[0] =
             (array<unsigned_int,_1UL>)
             wide_integer::operator-((uintwide_t<32U,_unsigned_int,_void,_true> *)&local_7c,v);
        uVar6 = wide_integer::uintwide_t::operator_cast_to_unsigned_int((uintwide_t *)&local_80);
        uStack_78 = uStack_78 - 1;
        pcVar9 = detail::fixed_static_array<char,_19U>::operator[]
                           ((fixed_static_array<char,_19U> *)&pos_1,(size_type_conflict)uStack_78);
        *pcVar9 = (char)uVar6 + '0';
      }
    }
    if (0 < (long)uStack_78) {
      if ((show_pos) && ((str_temp_1.super_array<char,_19UL>.elems[0xb] & 1U) == 0)) {
        uStack_78 = uStack_78 - 1;
        pcVar9 = detail::fixed_static_array<char,_19U>::operator[]
                           ((fixed_static_array<char,_19U> *)&pos_1,(size_type_conflict)uStack_78);
        *pcVar9 = '+';
      }
      else if ((str_temp_1.super_array<char,_19UL>.elems[0xb] & 1U) != 0) {
        uStack_78 = uStack_78 - 1;
        pcVar9 = detail::fixed_static_array<char,_19U>::operator[]
                           ((fixed_static_array<char,_19U> *)&pos_1,(size_type_conflict)uStack_78);
        *pcVar9 = '-';
      }
    }
    if (field_width != 0) {
      sVar10 = detail::array_detail::array<char,_19UL>::size();
      register0x00000000 = sVar10 - 1;
      field_width = detail::min_unsafe<unsigned_long>
                              (&field_width,
                               (unsigned_long *)(str_temp_2.super_array<char,_16UL>.elems + 0xc));
      while (uVar3 = uStack_78, sVar10 = detail::array_detail::array<char,_19UL>::size(),
            cVar1 = fill_char_str, (long)((sVar10 - 1) - field_width) < (long)uVar3) {
        uStack_78 = uStack_78 - 1;
        pcVar9 = detail::fixed_static_array<char,_19U>::operator[]
                           ((fixed_static_array<char,_19U> *)&pos_1,(size_type_conflict)uStack_78);
        *pcVar9 = cVar1;
      }
    }
    sVar10 = detail::array_detail::array<char,_19UL>::size();
    pcVar9 = detail::fixed_static_array<char,_19U>::operator[]
                       ((fixed_static_array<char,_19U> *)&pos_1,(int)sVar10 - 1);
    *pcVar9 = '\0';
    pcVar11 = detail::array_detail::array<char,_19UL>::data((array<char,_19UL> *)&pos_1);
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar11 + uStack_78);
  }
  else if (base_rep == '\x10') {
    uintwide_t<32U,_unsigned_int,_void,_false>::uintwide_t<true,_nullptr>
              ((uintwide_t<32U,_unsigned_int,_void,_false> *)
               (str_temp_2.super_array<char,_16UL>.elems + 8),
               (uintwide_t<32U,_unsigned_int,_void,_true> *)this);
    memset((void *)((long)&pos_2 + 4),0,0x10);
    detail::fixed_static_array<char,_16U>::fixed_static_array
              ((fixed_static_array<char,_16U> *)((long)&pos_2 + 4));
    sVar5 = detail::fixed_static_array<char,_16U>::static_size();
    dst = (unsigned_fast_type)(sVar5 - 1);
    bVar4 = uintwide_t<32U,_unsigned_int,_void,_false>::is_zero
                      ((uintwide_t<32U,_unsigned_int,_void,_false> *)
                       (str_temp_2.super_array<char,_16UL>.elems + 8));
    if (bVar4) {
      dst = dst - 1;
      pcVar12 = detail::fixed_static_array<char,_16U>::operator[]
                          ((fixed_static_array<char,_16U> *)((long)&pos_2 + 4),
                           (size_type_conflict)dst);
      *pcVar12 = '0';
    }
    else {
      pcVar12 = detail::fixed_static_array<char,_16U>::operator[]
                          ((fixed_static_array<char,_16U> *)((long)&pos_2 + 4),
                           (size_type_conflict)dst);
      local_b8 = uintwide_t<32U,_unsigned_int,_void,_true>::extract_hex_digits<false,_nullptr>
                           ((uintwide_t<32U,_unsigned_int,_void,_false> *)
                            (str_temp_2.super_array<char,_16UL>.elems + 8),pcVar12,is_uppercase);
      dst = dst - local_b8;
    }
    if ((show_base) && (1 < (long)dst)) {
      local_119 = 'X';
      if (!is_uppercase) {
        local_119 = 'x';
      }
      dst = dst - 1;
      pcVar12 = detail::fixed_static_array<char,_16U>::operator[]
                          ((fixed_static_array<char,_16U> *)((long)&pos_2 + 4),
                           (size_type_conflict)dst);
      *pcVar12 = local_119;
      dst = dst - 1;
      pcVar12 = detail::fixed_static_array<char,_16U>::operator[]
                          ((fixed_static_array<char,_16U> *)((long)&pos_2 + 4),
                           (size_type_conflict)dst);
      *pcVar12 = '0';
    }
    if ((show_pos) && (0 < (long)dst)) {
      dst = dst - 1;
      pcVar12 = detail::fixed_static_array<char,_16U>::operator[]
                          ((fixed_static_array<char,_16U> *)((long)&pos_2 + 4),
                           (size_type_conflict)dst);
      *pcVar12 = '+';
    }
    if (field_width != 0) {
      sVar10 = detail::array_detail::array<char,_16UL>::size();
      local_c0 = sVar10 - 1;
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_c0);
      while (uVar2 = dst, sVar10 = detail::array_detail::array<char,_16UL>::size(),
            cVar1 = fill_char_str, (long)((sVar10 - 1) - field_width) < (long)uVar2) {
        dst = dst - 1;
        pcVar12 = detail::fixed_static_array<char,_16U>::operator[]
                            ((fixed_static_array<char,_16U> *)((long)&pos_2 + 4),
                             (size_type_conflict)dst);
        *pcVar12 = cVar1;
      }
    }
    sVar10 = detail::array_detail::array<char,_16UL>::size();
    pcVar12 = detail::fixed_static_array<char,_16U>::operator[]
                        ((fixed_static_array<char,_16U> *)((long)&pos_2 + 4),(int)sVar10 - 1);
    *pcVar12 = '\0';
    pcVar13 = detail::array_detail::array<char,_16UL>::data((array<char,_16UL> *)((long)&pos_2 + 4))
    ;
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar13 + dst);
  }
  else {
    mask._3_1_ = false;
  }
  return mask._3_1_;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }